

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psvimg-create.c
# Opt level: O2

int is_backup(char *title)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = strcmp(title,"app");
  uVar2 = 0;
  uVar3 = 0;
  if (iVar1 != 0) {
    iVar1 = strcmp(title,"patch");
    if (iVar1 != 0) {
      iVar1 = strcmp(title,"addcont");
      if (iVar1 != 0) {
        iVar1 = strcmp(title,"savedata");
        uVar2 = uVar3;
        if (iVar1 != 0) {
          iVar1 = strcmp(title,"appmeta");
          if (iVar1 != 0) {
            iVar1 = strcmp(title,"license");
            if (iVar1 != 0) {
              iVar1 = strcmp(title,"game");
              uVar2 = (uint)(iVar1 != 0);
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int is_backup(const char *title) {
  if (strcmp(title, "app") == 0 ||
      strcmp(title, "patch") == 0 ||
      strcmp(title, "addcont") == 0 ||
      strcmp(title, "savedata") == 0 ||
      strcmp(title, "appmeta") == 0 ||
      strcmp(title, "license") == 0 ||
      strcmp(title, "game") == 0) {
    return 0;
  } else {
    return 1;
  }
}